

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tournser.cpp
# Opt level: O3

void __thiscall tournser::print_summary(tournser *this)

{
  ofstream *poVar1;
  bool bVar2;
  char cVar3;
  ostream *poVar4;
  long lVar5;
  vector<float,_std::allocator<float>_> inf_pairs;
  vector<float,_std::allocator<float>_> local_48;
  
  if (this->python == false) {
    num_infinite_pairs(&local_48,this);
    poVar1 = &this->outfile;
    cVar3 = (char)poVar1;
    std::ios::widen((char)*(undefined8 *)(*(long *)&this->outfile + -0x18) + cVar3);
    std::ostream::put(cVar3);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"# Betti Numbers:",0x10);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + cVar3);
    std::ostream::put(cVar3);
    std::ostream::flush();
    if (-1 < this->dim_max) {
      lVar5 = 0;
      do {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"#        dim H_",0xf);
        poVar4 = std::ostream::_M_insert<long>((long)poVar1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4," = ",3);
        std::ostream::_M_insert<double>
                  ((double)local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                           super__Vector_impl_data._M_start[lVar5]);
        if ((this->skipped_entries).
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start[lVar5] != 0) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," : (",4);
          poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4," entries skipped)",0x11);
        }
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + cVar3);
        std::ostream::put(cVar3);
        std::ostream::flush();
        bVar2 = lVar5 < this->dim_max;
        lVar5 = lVar5 + 1;
      } while (bVar2);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + cVar3);
    std::ostream::put(cVar3);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"# Cell Counts:",0xe);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + cVar3);
    std::ostream::put(cVar3);
    std::ostream::flush();
    if (-1 < this->dim_max) {
      lVar5 = -1;
      do {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"#        dim C_",0xf);
        lVar5 = lVar5 + 1;
        poVar4 = std::ostream::_M_insert<long>((long)poVar1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4," = ",3);
        poVar4 = std::ostream::_M_insert<long>((long)poVar4);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
        std::ostream::put((char)poVar4);
        std::ostream::flush();
      } while (lVar5 < this->dim_max);
    }
    std::ostream::flush();
    std::ofstream::close();
    if (local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  return;
}

Assistant:

void print_summary(){
		if(!python){
			std::vector<value_t> inf_pairs = num_infinite_pairs();
			outfile << std::endl;
			outfile << "# Betti Numbers:" << std::endl;
			for(index_t i = 0; i <= dim_max; i++){
				outfile << "#        dim H_" << i << " = " << inf_pairs[i];
				if( skipped_entries[i] > 0){
					outfile << " : (" << skipped_entries[i] << " entries skipped)";
				}
				outfile << std::endl;
			}
			outfile << std::endl;
			outfile << "# Cell Counts:" << std::endl;
			for(index_t i = 0; i <= dim_max; i++){
				outfile << "#        dim C_" << i << " = " << complex->number_of_cells(i) << std::endl;
			}
			outfile.flush();
			outfile.close();
		}
	}